

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.c
# Opt level: O2

int main(void)

{
  gdImagePtr pgVar1;
  long lVar2;
  gdImagePtr pgVar3;
  
  pgVar1 = (gdImagePtr)gdImageCreateTrueColor(400,400);
  if (pgVar1 == (gdImagePtr)0x0) {
    fwrite("Can\'t create 400x400 TC image\n",0x1e,1,_stderr);
  }
  else {
    gdImageFilledRectangle(pgVar1,0x13,0x1d,0x186,0x186,0xffffff);
    pgVar3 = pgVar1;
    gdImageRectangle(pgVar1,0x13,0x1d,0x186,0x186,0xff0000);
    save_png(pgVar3,"a1.png");
    pgVar3 = pgVar1;
    lVar2 = gdImageCropAuto(pgVar1,4);
    if (lVar2 != 0) {
      save_png(pgVar3,"a2.png");
      gdImageDestroy(lVar2);
    }
    gdImageDestroy(pgVar1);
    read_png("test_crop_threshold.png");
  }
  return 1;
}

Assistant:

int main()
{
	gdImagePtr im, im2;

	im = gdImageCreateTrueColor(400, 400);

	if (!im) {
		fprintf(stderr, "Can't create 400x400 TC image\n");
		return 1;
	}

	gdImageFilledRectangle(im, 19, 29, 390, 390, 0xFFFFFF);
	gdImageRectangle(im, 19, 29, 390, 390, 0xFF0000);
	save_png(im, "a1.png");

	im2 = gdImageCropAuto(im, GD_CROP_SIDES);
	if (im2) {
		save_png(im2, "a2.png");
		gdImageDestroy(im2);
	}
	gdImageDestroy(im);

	im = read_png("test_crop_threshold.png");
	if (!im) {
		return 1;
	}

	im2 = gdImageCropThreshold(im, 0xFFFFFF, 0.6);
	if (im2) {
		save_png(im2, "a4.png");
		gdImageDestroy(im2);
	}

	gdImageDestroy(im);
	return 0;
}